

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void __thiscall duckdb::UpdateSegment::InitializeUpdateInfo(UpdateSegment *this,idx_t vector_idx)

{
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *this_00;
  pointer *ppUVar1;
  BufferManager *manager;
  _Head_base<0UL,_duckdb::UpdateNode_*,_false> this_01;
  iterator __position;
  _Head_base<0UL,_duckdb::UpdateNode_*,_false> this_02;
  pointer pUVar2;
  ulong uVar3;
  
  this_00 = &this->root;
  if ((this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
      super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl == (UpdateNode *)0x0) {
    manager = this->column_data->block_manager->buffer_manager;
    this_02._M_head_impl = (UpdateNode *)operator_new(0x30);
    UpdateNode::UpdateNode(this_02._M_head_impl,manager);
    this_01._M_head_impl =
         (this_00->super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>).
         _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>
         .super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
    super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl = this_02._M_head_impl;
    if (this_01._M_head_impl != (UpdateNode *)0x0) {
      UpdateNode::~UpdateNode(this_01._M_head_impl);
      operator_delete(this_01._M_head_impl);
    }
  }
  pUVar2 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::operator->
                     (this_00);
  if ((ulong)((long)(pUVar2->info).
                    super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    .
                    super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pUVar2->info).
                    super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    .
                    super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) <= vector_idx) {
    pUVar2 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
             operator->(this_00);
    ::std::vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>::reserve
              (&(pUVar2->info).
                super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>,
               vector_idx + 1);
    pUVar2 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
             operator->(this_00);
    for (uVar3 = (long)(pUVar2->info).
                       super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       .
                       super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pUVar2->info).
                       super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       .
                       super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4; uVar3 <= vector_idx;
        uVar3 = uVar3 + 1) {
      pUVar2 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
               operator->(this_00);
      __position._M_current =
           (pUVar2->info).
           super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>.
           super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pUVar2->info).
          super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>.
          super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>::
        _M_realloc_insert<>(&(pUVar2->info).
                             super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                            ,__position);
      }
      else {
        (__position._M_current)->entry = (UndoBufferEntry *)0x0;
        (__position._M_current)->position = 0;
        ppUVar1 = &(pUVar2->info).
                   super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                   .
                   super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppUVar1 = *ppUVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void UpdateSegment::InitializeUpdateInfo(idx_t vector_idx) {
	// create the versions for this segment, if there are none yet
	if (!root) {
		root = make_uniq<UpdateNode>(column_data.block_manager.buffer_manager);
	}
	if (vector_idx < root->info.size()) {
		return;
	}
	root->info.reserve(vector_idx + 1);
	for (idx_t i = root->info.size(); i <= vector_idx; i++) {
		root->info.emplace_back();
	}
}